

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O0

bool __thiscall Assimp::MD5::MD5Parser::ParseSection(MD5Parser *this,Section *out)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_> *this_00;
  allocator local_99;
  string local_98 [32];
  reference local_78;
  Element *elem;
  byte local_5e;
  byte local_5d;
  bool run;
  bool running;
  allocator local_49;
  string local_48 [32];
  char *local_28;
  char *sz;
  Section *out_local;
  MD5Parser *this_local;
  
  out->iLineNumber = this->lineNumber;
  local_28 = this->buffer;
  sz = (char *)out;
  out_local = (Section *)this;
  while (bVar2 = IsSpaceOrNewLine<char>(*this->buffer), pcVar1 = local_28,
        ((bVar2 ^ 0xffU) & 1) != 0) {
    this->buffer = this->buffer + 1;
  }
  uVar3 = (long)this->buffer - (long)local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar1,uVar3,&local_49);
  std::__cxx11::string::operator=((string *)(sz + 0x20),local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  SkipSpaces(this);
  local_5d = 1;
  while ((local_5d & 1) != 0) {
    if (*this->buffer == '{') {
      this->buffer = this->buffer + 1;
      local_5e = 1;
      goto LAB_0069a78e;
    }
    bVar2 = IsSpaceOrNewLine<char>(*this->buffer);
    if (bVar2) break;
    local_28 = this->buffer;
    do {
      pcVar1 = this->buffer;
      this->buffer = pcVar1 + 1;
      bVar2 = IsSpaceOrNewLine<char>(*pcVar1);
      pcVar1 = local_28;
    } while (((bVar2 ^ 0xffU) & 1) != 0);
    uVar3 = (long)this->buffer - (long)local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,uVar3,&local_99);
    std::__cxx11::string::operator=((string *)(sz + 0x40),local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  goto LAB_0069a9bc;
LAB_0069a78e:
  if ((local_5e & 1) != 0) {
    bVar2 = SkipSpacesAndLineEnd(this);
    if (!bVar2) {
      return false;
    }
    if (*this->buffer == '}') {
      this->buffer = this->buffer + 1;
      goto LAB_0069a9bc;
    }
    this_00 = (vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_> *)(sz + 8);
    memset(&elem,0,0x10);
    std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::push_back
              (this_00,(value_type *)&elem);
    local_78 = std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::back
                         ((vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_> *)
                          (sz + 8));
    local_78->iLineNumber = this->lineNumber;
    local_78->szStart = this->buffer;
    while (bVar2 = IsLineEnd<char>(*this->buffer), ((bVar2 ^ 0xffU) & 1) != 0) {
      this->buffer = this->buffer + 1;
    }
    if (*this->buffer != '\0') {
      this->lineNumber = this->lineNumber + 1;
      pcVar1 = this->buffer;
      this->buffer = pcVar1 + 1;
      *pcVar1 = '\0';
    }
    goto LAB_0069a78e;
  }
LAB_0069a9bc:
  bVar2 = SkipSpacesAndLineEnd(this);
  return bVar2;
}

Assistant:

bool MD5Parser::ParseSection(Section& out)
{
    // store the current line number for use in error messages
    out.iLineNumber = lineNumber;

    // first parse the name of the section
    char* sz = buffer;
    while (!IsSpaceOrNewLine( *buffer))buffer++;
    out.mName = std::string(sz,(uintptr_t)(buffer-sz));
    SkipSpaces();

    bool running = true;
    while (running) {
        if ('{' == *buffer) {
            // it is a normal section so read all lines
            buffer++;
            bool run = true;
            while (run)
            {
                if (!SkipSpacesAndLineEnd()) {
                    return false; // seems this was the last section
                }
                if ('}' == *buffer) {
                    buffer++;
                    break;
                }

                out.mElements.push_back(Element());
                Element& elem = out.mElements.back();

                elem.iLineNumber = lineNumber;
                elem.szStart = buffer;

                // terminate the line with zero
                while (!IsLineEnd( *buffer))buffer++;
                if (*buffer) {
                    ++lineNumber;
                    *buffer++ = '\0';
                }
            }
            break;
        }
        else if (!IsSpaceOrNewLine(*buffer))    {
            // it is an element at global scope. Parse its value and go on
            sz = buffer;
            while (!IsSpaceOrNewLine( *buffer++));
            out.mGlobalValue = std::string(sz,(uintptr_t)(buffer-sz));
            continue;
        }
        break;
    }
    return SkipSpacesAndLineEnd();
}